

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void separatetobefnz(global_State *g,int all)

{
  GCObject *pGVar1;
  GCObject *pGVar2;
  GCObject **ppGVar3;
  GCObject *pGVar4;
  GCObject *pGVar5;
  
  pGVar5 = (GCObject *)&g->tobefnz;
  do {
    pGVar2 = pGVar5;
    pGVar5 = pGVar2->next;
  } while (pGVar2->next != (GCObject *)0x0);
  pGVar5 = g->finobjold1;
  if (g->finobj != pGVar5) {
    ppGVar3 = &g->finobj;
    pGVar4 = g->finobj;
    do {
      if ((pGVar4->marked & 0x40) == 0) {
        __assert_fail("(((curr)->marked) & ((1<<(6))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x42f,"void separatetobefnz(global_State *, int)");
      }
      if ((pGVar4->marked & 0x18) != 0 || all != 0) {
        pGVar5 = pGVar4->next;
        if (pGVar4 == g->finobjsur) {
          g->finobjsur = pGVar5;
        }
        *ppGVar3 = pGVar5;
        pGVar4->next = pGVar2->next;
        pGVar2->next = pGVar4;
        pGVar5 = g->finobjold1;
        pGVar2 = pGVar4;
        pGVar4 = (GCObject *)ppGVar3;
      }
      pGVar1 = pGVar4->next;
      ppGVar3 = &pGVar4->next;
      pGVar4 = pGVar1;
    } while (pGVar1 != pGVar5);
  }
  return;
}

Assistant:

static void separatetobefnz (global_State *g, int all) {
  GCObject *curr;
  GCObject **p = &g->finobj;
  GCObject **lastnext = findlast(&g->tobefnz);
  while ((curr = *p) != g->finobjold1) {  /* traverse all finalizable objects */
    lua_assert(tofinalize(curr));
    if (!(iswhite(curr) || all))  /* not being collected? */
      p = &curr->next;  /* don't bother with it */
    else {
      if (curr == g->finobjsur)  /* removing 'finobjsur'? */
        g->finobjsur = curr->next;  /* correct it */
      *p = curr->next;  /* remove 'curr' from 'finobj' list */
      curr->next = *lastnext;  /* link at the end of 'tobefnz' list */
      *lastnext = curr;
      lastnext = &curr->next;
    }
  }
}